

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

string * __thiscall
AssemblyCode::MoveMemFromRegPlusConstToReg::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MoveMemFromRegPlusConstToReg *this)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if (this->constant < 1) {
    IRT::CTemp::ToString_abi_cxx11_(&local_50,&this->target);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x15facd);
    local_70 = &local_60;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = puVar5[3];
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*puVar5;
    }
    local_68 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    puVar9 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar9) {
      local_120 = *puVar9;
      lStack_118 = puVar5[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *puVar9;
      local_130 = (ulong *)*puVar5;
    }
    local_128 = puVar5[1];
    *puVar5 = puVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    IRT::CTemp::ToString_abi_cxx11_(&local_90,&this->source);
    uVar11 = 0xf;
    if (local_130 != &local_120) {
      uVar11 = local_120;
    }
    if (uVar11 < local_90._M_string_length + local_128) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar12 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_90._M_string_length + local_128) goto LAB_0014c1eb;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
    }
    else {
LAB_0014c1eb:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
    }
    local_110 = &local_100;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_100 = *puVar1;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *puVar1;
      local_110 = (undefined8 *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    puVar9 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar9) {
      local_a0 = *puVar9;
      lStack_98 = puVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar9;
      local_b0 = (ulong *)*puVar5;
    }
    local_a8 = puVar5[1];
    *puVar5 = puVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    uVar13 = this->constant;
    uVar2 = -uVar13;
    if (0 < (int)uVar13) {
      uVar2 = uVar13;
    }
    uVar13 = 1;
    if (9 < uVar2) {
      uVar11 = (ulong)uVar2;
      uVar14 = 4;
      do {
        uVar13 = uVar14;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0014c51d;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0014c51d;
        }
        if (uVar7 < 10000) goto LAB_0014c51d;
        uVar11 = uVar11 / 10000;
        uVar14 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_0014c51d:
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0,uVar13,uVar2);
    uVar11 = 0xf;
    if (local_b0 != &local_a0) {
      uVar11 = local_a0;
    }
    if (uVar11 < (ulong)(local_c8 + local_a8)) {
      uVar11 = 0xf;
      if (local_d0 != local_c0) {
        uVar11 = local_c0[0];
      }
      if (uVar11 < (ulong)(local_c8 + local_a8)) goto LAB_0014c58d;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_0014c58d:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
    }
    local_f0 = &local_e0;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_e0 = *puVar1;
      uStack_d8 = puVar5[3];
    }
    else {
      local_e0 = *puVar1;
      local_f0 = (undefined8 *)*puVar5;
    }
    local_e8 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar10) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_70 == &local_60) goto LAB_0014c4e9;
  }
  else {
    IRT::CTemp::ToString_abi_cxx11_(&local_50,&this->target);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x15facd);
    local_70 = &local_60;
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_120 = *puVar9;
      lStack_118 = plVar4[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *puVar9;
      local_130 = (ulong *)*plVar4;
    }
    local_128 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    IRT::CTemp::ToString_abi_cxx11_(&local_90,&this->source);
    uVar11 = 0xf;
    if (local_130 != &local_120) {
      uVar11 = local_120;
    }
    if (uVar11 < local_90._M_string_length + local_128) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar12 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_90._M_string_length + local_128) goto LAB_0014bfdb;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
    }
    else {
LAB_0014bfdb:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
    }
    local_110 = &local_100;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_100 = *puVar1;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *puVar1;
      local_110 = (undefined8 *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_a0 = *puVar9;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar9;
      local_b0 = (ulong *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar13 = this->constant;
    uVar2 = -uVar13;
    if (0 < (int)uVar13) {
      uVar2 = uVar13;
    }
    uVar14 = 1;
    if (9 < uVar2) {
      uVar11 = (ulong)uVar2;
      uVar7 = 4;
      do {
        uVar14 = uVar7;
        uVar6 = (uint)uVar11;
        if (uVar6 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0014c32d;
        }
        if (uVar6 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0014c32d;
        }
        if (uVar6 < 10000) goto LAB_0014c32d;
        uVar11 = uVar11 / 10000;
        uVar7 = uVar14 + 4;
      } while (99999 < uVar6);
      uVar14 = uVar14 + 1;
    }
LAB_0014c32d:
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar14 - (char)((int)uVar13 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_d0 + (ulong)(uVar13 >> 0x1f)),uVar14,uVar2);
    uVar11 = 0xf;
    if (local_b0 != &local_a0) {
      uVar11 = local_a0;
    }
    if (uVar11 < (ulong)(local_c8 + local_a8)) {
      uVar11 = 0xf;
      if (local_d0 != local_c0) {
        uVar11 = local_c0[0];
      }
      if (uVar11 < (ulong)(local_c8 + local_a8)) goto LAB_0014c3a5;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_0014c3a5:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
    }
    local_f0 = &local_e0;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_e0 = *puVar1;
      uStack_d8 = puVar5[3];
    }
    else {
      local_e0 = *puVar1;
      local_f0 = (undefined8 *)*puVar5;
    }
    local_e8 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar10) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_70 == &local_60) goto LAB_0014c4e9;
  }
  operator_delete(local_70);
LAB_0014c4e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::MoveMemFromRegPlusConstToReg::ToString( ) const {
    if (constant > 0) {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " + " + std::to_string( constant ) + "]\n";
    } else {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " - " + std::to_string( abs(constant) ) + "]\n";
    }
}